

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RtreeNode *pNode;
  sqlite3_str *in_RDI;
  long in_FS_OFFSET;
  int jj;
  sqlite3_str *pOut;
  int errCode;
  int nData;
  int ii;
  RtreeNode node;
  RtreeCell cell;
  Rtree tree;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  sqlite3_context *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 uVar6;
  int local_444;
  undefined1 *local_428;
  undefined1 *local_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined8 local_400;
  float afStack_3f8 [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_428,0,0x28);
  local_428 = &DAT_aaaaaaaaaaaaaaaa;
  local_420 = &DAT_aaaaaaaaaaaaaaaa;
  local_418 = 0xaaaaaaaa;
  local_414 = 0xaaaaaaaa;
  local_410 = &DAT_aaaaaaaaaaaaaaaa;
  local_408 = &DAT_aaaaaaaaaaaaaaaa;
  memset(&stack0xfffffffffffffc30,0xaa,0x3c8);
  uVar6 = 0xaaaaaaaa;
  memset(&local_428,0,0x28);
  memset(&stack0xfffffffffffffc30,0,0x3c8);
  iVar3 = sqlite3_value_int((sqlite3_value *)0x295c67);
  bVar2 = (byte)iVar3;
  if ((bVar2 != 0) && (bVar2 < 6)) {
    local_410 = (undefined1 *)
                sqlite3_value_blob((sqlite3_value *)
                                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    if ((local_410 != (undefined1 *)0x0) &&
       ((iVar3 = sqlite3_value_bytes((sqlite3_value *)0x295ce1), 3 < iVar3 &&
        (iVar4 = readInt16(local_410 + 2), (int)(iVar4 * (uint)(byte)(bVar2 * '\b' + 8)) <= iVar3)))
       ) {
      pNode = (RtreeNode *)sqlite3_str_new((sqlite3 *)CONCAT44(in_stack_fffffffffffffba4,iVar3));
      local_444 = 0;
      while (iVar4 = local_444, iVar5 = readInt16(local_410 + 2), iVar4 < iVar5) {
        memcpy(&local_400,&DAT_002b0f08,0x30);
        nodeGetCell((Rtree *)CONCAT44(uVar6,in_stack_fffffffffffffbb0),pNode,-0x55555556,
                    (RtreeCell *)CONCAT44(iVar4,in_stack_fffffffffffffb98));
        if (0 < local_444) {
          sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffb90,
                             (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),0
                            );
        }
        sqlite3_str_appendf((StrAccum *)pNode,"{%lld",local_400);
        for (in_stack_fffffffffffffba4 = 0;
            in_stack_fffffffffffffba4 < (int)(uint)(byte)(bVar2 << 1);
            in_stack_fffffffffffffba4 = in_stack_fffffffffffffba4 + 1) {
          sqlite3_str_appendf((StrAccum *)(double)afStack_3f8[in_stack_fffffffffffffba4],
                              (char *)pNode," %g");
        }
        sqlite3_str_append((sqlite3_str *)in_stack_fffffffffffffb90,
                           (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),0);
        local_444 = local_444 + 1;
      }
      sqlite3_str_errcode((sqlite3_str *)pNode);
      sqlite3_result_error_code(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
      sqlite3_str_finish(in_RDI);
      sqlite3_result_text((sqlite3_context *)CONCAT44(in_stack_fffffffffffffba4,iVar3),
                          (char *)CONCAT44(iVar4,in_stack_fffffffffffffb98),
                          (int)((ulong)in_RDI >> 0x20),
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  if( node.zData==0 ) return;
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_error_code(ctx, errCode);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
}